

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O0

void calc_similarity<double,unsigned_long>
               (double *numeric_data,int *categ_data,double *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,size_t nrows,bool use_long_double,int nthreads,
               bool assume_full_distr,bool standardize_dist,bool as_kernel,IsoForest *model_outputs,
               ExtIsoForest *model_outputs_ext,double *tmat,double *rmat,size_t n_from,
               bool use_indexed_references,TreesIndexer *indexer,bool is_col_major,size_t ld_numeric
               ,size_t ld_categ)

{
  bool bVar1;
  byte in_stack_00000008;
  size_t in_stack_000000e8;
  unsigned_long *in_stack_000000f0;
  unsigned_long *in_stack_000000f8;
  double *in_stack_00000100;
  int *in_stack_00000108;
  double *in_stack_00000110;
  IsoForest *in_stack_00000170;
  double *in_stack_00000180;
  TreesIndexer *in_stack_000001a0;
  size_t in_stack_000001b0;
  size_t in_stack_000001b8;
  byte local_61;
  
  local_61 = in_stack_00000008 & 1;
  if (local_61 != 0) {
    bVar1 = has_long_double();
    if (!bVar1) {
      local_61 = 0;
      fprintf(_stderr,"%s",
              "Passed \'use_long_double=true\', but library was compiled without long double support.\n"
             );
    }
  }
  if (((local_61 ^ 0xff) & 1) == 0) {
    calc_similarity_internal<double,unsigned_long,long_double>
              (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
               in_stack_000000f0,in_stack_000000e8,(int)model_outputs_ext,numeric_data._7_1_,
               numeric_data._6_1_,numeric_data._5_1_,in_stack_00000170,(ExtIsoForest *)indexer,
               in_stack_00000180,(double *)ld_numeric,ld_categ,numeric_data._4_1_,in_stack_000001a0,
               numeric_data._3_1_,in_stack_000001b0,in_stack_000001b8);
  }
  else {
    calc_similarity_internal<double,unsigned_long,double>
              (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
               in_stack_000000f0,in_stack_000000e8,(int)model_outputs_ext,numeric_data._7_1_,
               numeric_data._6_1_,numeric_data._5_1_,in_stack_00000170,(ExtIsoForest *)indexer,
               in_stack_00000180,(double *)ld_numeric,ld_categ,numeric_data._4_1_,in_stack_000001a0,
               numeric_data._3_1_,in_stack_000001b0,in_stack_000001b8);
  }
  return;
}

Assistant:

void calc_similarity(real_t numeric_data[], int categ_data[],
                     real_t Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                     size_t nrows, bool use_long_double, int nthreads,
                     bool assume_full_distr, bool standardize_dist, bool as_kernel,
                     IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                     double tmat[], double rmat[], size_t n_from, bool use_indexed_references,
                     TreesIndexer *indexer, bool is_col_major, size_t ld_numeric, size_t ld_categ)
{
    if (use_long_double && !has_long_double()) {
        use_long_double = false;
        print_errmsg("Passed 'use_long_double=true', but library was compiled without long double support.\n");
    }
    #ifndef NO_LONG_DOUBLE
    if (likely(!use_long_double))
    #endif
        calc_similarity_internal<real_t, sparse_ix, double>(
            numeric_data, categ_data,
            Xc, Xc_ind, Xc_indptr,
            nrows, nthreads,
            assume_full_distr, standardize_dist, as_kernel,
            model_outputs, model_outputs_ext,
            tmat, rmat, n_from, use_indexed_references,
            indexer, is_col_major, ld_numeric, ld_categ
        );
    #ifndef NO_LONG_DOUBLE
    else
        calc_similarity_internal<real_t, sparse_ix, long double>(
            numeric_data, categ_data,
            Xc, Xc_ind, Xc_indptr,
            nrows, nthreads,
            assume_full_distr, standardize_dist, as_kernel,
            model_outputs, model_outputs_ext,
            tmat, rmat, n_from, use_indexed_references,
            indexer, is_col_major, ld_numeric, ld_categ
        );
    #endif
}